

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>
          (basic_appender<char> out,unsigned_long value,uint prefix,format_specs *specs,
          digit_grouping<char> *grouping)

{
  uint uVar1;
  int num_digits;
  int iVar2;
  basic_appender<char> bVar3;
  uint uVar4;
  ulong size;
  uint prefix_local;
  anon_class_24_3_e2c60416 local_260;
  memory_buffer buffer;
  
  buffer.super_buffer<char>.ptr_ = buffer.store_;
  buffer.super_buffer<char>.size_ = 0;
  buffer.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  buffer.super_buffer<char>.capacity_ = 500;
  uVar1 = (specs->super_basic_specs).data_;
  prefix_local = prefix;
  switch(uVar1 & 7) {
  case 4:
    if ((uVar1 >> 0xd & 1) != 0) {
      uVar4 = (uint)((uVar1 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar1 = uVar4 << 8;
      if (prefix == 0) {
        uVar1 = uVar4;
      }
      prefix_local = (uVar1 | prefix) + 0x2000000;
    }
    prefix = prefix_local;
    num_digits = count_digits<4,unsigned_long>(value);
    format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
              (4,&buffer.super_buffer<char>,value,num_digits,
               (bool)((byte)((specs->super_basic_specs).data_ >> 0xc) & 1));
    break;
  case 5:
    num_digits = count_digits<3,unsigned_long>(value);
    if (((((specs->super_basic_specs).data_ & 0x2000) != 0) && (value != 0)) &&
       (specs->precision <= num_digits)) {
      uVar1 = 0x3000;
      if (prefix == 0) {
        uVar1 = 0x30;
      }
      prefix = (uVar1 | prefix) + 0x1000000;
      prefix_local = prefix;
    }
    format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
              (3,&buffer.super_buffer<char>,value,num_digits,false);
    break;
  case 6:
    if ((uVar1 >> 0xd & 1) != 0) {
      uVar4 = (uint)((uVar1 >> 0xc & 1) == 0) << 0xd | 0x4230;
      uVar1 = uVar4 << 8;
      if (prefix == 0) {
        uVar1 = uVar4;
      }
      prefix_local = (uVar1 | prefix) + 0x2000000;
    }
    prefix = prefix_local;
    num_digits = count_digits<1,unsigned_long>(value);
    format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
              (1,&buffer.super_buffer<char>,value,num_digits,false);
    break;
  case 7:
    bVar3 = write_char<char,fmt::v11::basic_appender<char>>(out,(char)value,specs);
    goto LAB_001e5294;
  default:
    num_digits = do_count_digits(value);
    format_decimal<char,_unsigned_long,_fmt::v11::basic_appender<char>,_0>
              (&buffer.super_buffer<char>,value,num_digits);
  }
  iVar2 = digit_grouping<char>::count_separators(grouping,num_digits);
  size = (ulong)((prefix >> 0x18) + num_digits + iVar2);
  local_260.prefix = &prefix_local;
  local_260.buffer = &buffer;
  local_260.grouping = grouping;
  bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>(fmt::v11::basic_appender<char>,unsigned_long,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (out,specs,size,size,&local_260);
LAB_001e5294:
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&buffer);
  return (basic_appender<char>)bVar3.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}